

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O2

uint32_t * FastPForLib::__fastunpack16_8(uint32_t *in,uint32_t *out)

{
  undefined1 auVar1 [32];
  
  auVar1 = vpmovzxwd_avx2(*(undefined1 (*) [16])in);
  *(undefined1 (*) [32])out = auVar1;
  return in + 4;
}

Assistant:

const uint32_t *__fastunpack16_8(const uint32_t *__restrict__ in,
                                 uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  out++;

  return in;
}